

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O1

void emitfromone(opcodetype opcode,char *label,int tabindex)

{
  datatype dVar1;
  char source [10];
  short local_2a;
  char local_28;
  
  getlabel(tabindex,(char *)&local_2a);
  fprintf((FILE *)ofp,"         %-10s%s, ",opcodestr[opcode],label);
  if (local_28 == 'p' && local_2a == 0x625b) {
    dVar1 = data_class(tabindex);
    if (dVar1 == dtreal) {
      putc(100,(FILE *)ofp);
    }
    fwrite("word ptr ",9,1,(FILE *)ofp);
  }
  fprintf((FILE *)ofp,"%s\n",&local_2a);
  return;
}

Assistant:

void    emitfromone(enum opcodetype opcode, char *label, int tabindex)
{
    char    source[LABELSIZE];
    
    getlabel(tabindex, source);
    
    fprintf(ofp, "         %-10s%s, ", opcodestr[opcode], label);
    if (strncmp(source, "[bp", 3) == 0)    {
        if (data_class(tabindex) == dtreal)
            putc('d', ofp);
        fprintf(ofp, "word ptr ");
    }
    
    fprintf(ofp, "%s\n", source);
}